

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::BaseRAPass::_markStackArgsToKeep(BaseRAPass *this)

{
  byte bVar1;
  undefined1 uVar2;
  byte bVar3;
  uint uVar4;
  FuncNode *pFVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int *piVar14;
  bool bVar15;
  
  pFVar5 = this->_func;
  bVar15 = true;
  if (((pFVar5->_frame)._attributes & kHasPreservedFP) == kNoAttributes) {
    bVar15 = (pFVar5->_frame)._finalStackAlignment < (pFVar5->_frame)._minDynamicAlignment;
  }
  uVar4 = *(uint *)&this->field_0x148;
  if ((ulong)uVar4 != 0) {
    lVar6 = *(long *)&this->_workRegs;
    puVar10 = &this->field_0x22c;
    uVar11 = 0;
    do {
      lVar7 = *(long *)(lVar6 + uVar11 * 8);
      if ((*(byte *)(lVar7 + 0x25) & 4) == 0) goto LAB_00128a86;
      bVar1 = *(byte *)(lVar7 + 0x48);
      if (bVar1 == 0xff) {
        _markStackArgsToKeep();
LAB_00128a9e:
        _markStackArgsToKeep();
        return 3;
      }
      if (0x1f < bVar1) goto LAB_00128a9e;
      lVar8 = *(long *)(lVar7 + 0x18);
      if (lVar8 == 0) {
        return 3;
      }
      if (((!bVar15) || ((*(uint *)(&pFVar5->field_0xd0 + (ulong)bVar1 * 0x10) & 0x600) != 0x200))
         || (*(uint *)(lVar8 + 4) !=
             (uint)(byte)TypeUtils::_typeData
                         [(ulong)(byte)*(uint *)(&pFVar5->field_0xd0 + (ulong)bVar1 * 0x10) + 0x100]
            )) {
        uVar13 = (ulong)*(byte *)(lVar7 + 0x49);
        if (uVar13 < 4) {
          if (*(uint *)(puVar10 + uVar13 * 4 + (ulong)bVar1 * 0x10) < 0x1000) {
            *(uint *)(puVar10 + uVar13 * 4 + (ulong)bVar1 * 0x10) =
                 *(uint *)(puVar10 + uVar13 * 4 + (ulong)bVar1 * 0x10) | 0x200;
            goto LAB_00128a86;
          }
        }
        else {
          _markStackArgsToKeep();
        }
        _markStackArgsToKeep();
        uVar4 = *(uint *)(puVar10 + 0x148);
        if ((ulong)uVar4 == 0) {
          return 0;
        }
        lVar6 = *(long *)(puVar10 + 0x98);
        lVar7 = *(long *)(puVar10 + 0x140);
        uVar2 = puVar10[0x1ec];
        uVar11 = 0;
        goto LAB_00128af3;
      }
      *(byte *)(lVar8 + 2) = *(byte *)(lVar8 + 2) | 2;
LAB_00128a86:
      uVar11 = uVar11 + 1;
    } while (uVar4 != uVar11);
  }
  return 0;
LAB_00128af3:
  lVar8 = *(long *)(lVar7 + uVar11 * 8);
  if ((*(byte *)(lVar8 + 0x25) & 4) != 0) {
    bVar1 = *(byte *)(lVar8 + 0x48);
    if (bVar1 == 0xff) {
      _updateStackArgs();
      return 3;
    }
    puVar9 = *(undefined1 **)(lVar8 + 0x18);
    if (puVar9 == (undefined1 *)0x0) {
      return 3;
    }
    if ((puVar9[2] & 2) == 0) {
      if (0x1f < bVar1) {
LAB_00128bbb:
        _updateStackArgs();
LAB_00128bc0:
        _updateStackArgs();
        return 3;
      }
      bVar3 = *(byte *)(lVar8 + 0x49);
      if (3 < bVar3) goto LAB_00128bc0;
      lVar8 = (ulong)bVar1 * 0x10 + 0x22c;
      *(uint *)(puVar10 + (ulong)bVar3 * 4 + lVar8) =
           *(uint *)(puVar10 + (ulong)bVar3 * 4 + lVar8) & 0xfff | *(int *)(puVar9 + 0x10) << 0xc;
    }
    else {
      if (0x1f < bVar1) {
        _updateStackArgs();
        goto LAB_00128bbb;
      }
      piVar14 = (int *)((ulong)bVar1 * 0x10 + lVar6 + 0xd0);
      if ((*(byte *)(lVar6 + 0x2d0) & 0x10) == 0) {
        iVar12 = (*piVar14 >> 0xc) + *(int *)(lVar6 + 0x2f4);
      }
      else {
        *puVar9 = uVar2;
        iVar12 = (*piVar14 >> 0xc) + *(int *)(lVar6 + 0x2f8);
      }
      *(int *)(puVar9 + 0x10) = iVar12;
    }
  }
  uVar11 = uVar11 + 1;
  if (uVar4 == uVar11) {
    return 0;
  }
  goto LAB_00128af3;
}

Assistant:

Error BaseRAPass::_markStackArgsToKeep() noexcept {
  FuncFrame& frame = func()->frame();
  bool hasSAReg = frame.hasPreservedFP() || !frame.hasDynamicAlignment();

  RAWorkRegs& workRegs = _workRegs;
  uint32_t numWorkRegs = workRegCount();

  for (uint32_t workId = 0; workId < numWorkRegs; workId++) {
    RAWorkReg* workReg = workRegs[workId];
    if (workReg->hasFlag(RAWorkRegFlags::kStackArgToStack)) {
      ASMJIT_ASSERT(workReg->hasArgIndex());
      const FuncValue& srcArg = _func->detail().arg(workReg->argIndex());

      // If the register doesn't have stack slot then we failed. It doesn't make much sense as it was marked as
      // `kFlagStackArgToStack`, which requires the WorkReg was live-in upon function entry.
      RAStackSlot* slot = workReg->stackSlot();
      if (ASMJIT_UNLIKELY(!slot))
        return DebugUtils::errored(kErrorInvalidState);

      if (hasSAReg && srcArg.isStack() && !srcArg.isIndirect()) {
        uint32_t typeSize = TypeUtils::sizeOf(srcArg.typeId());
        if (typeSize == slot->size()) {
          slot->addFlags(RAStackSlot::kFlagStackArg);
          continue;
        }
      }

      // NOTE: Update StackOffset here so when `_argsAssignment.updateFuncFrame()` is called it will take into
      // consideration moving to stack slots. Without this we may miss some scratch registers later.
      FuncValue& dstArg = _argsAssignment.arg(workReg->argIndex(), workReg->argValueIndex());
      dstArg.assignStackOffset(0);
    }
  }

  return kErrorOk;
}